

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseMapPair<llbuild::core::KeyID,_DBKeyID> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::InsertIntoBucketImpl<llbuild::core::KeyID>
          (DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
           *this,KeyID *Key,KeyID *Lookup,DenseMapPair<llbuild::core::KeyID,_DBKeyID> *TheBucket)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  KeyID *LHS;
  KeyID local_38;
  KeyID EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *TheBucket_local;
  KeyID *Lookup_local;
  KeyID *Key_local;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)Lookup;
  Lookup_local = Key;
  Key_local = (KeyID *)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar3 = getNumEntries(this);
  EmptyKey._value._4_4_ = uVar3 + 1;
  uVar3 = getNumBuckets(this);
  iVar1 = EmptyKey._value._4_4_;
  EmptyKey._value._0_4_ = uVar3;
  if ((uint)(EmptyKey._value._4_4_ << 2) < uVar3 * 3) {
    uVar4 = getNumTombstones(this);
    if (uVar3 - (iVar1 + uVar4) <= (uint)EmptyKey._value >> 3) {
      grow(this,(uint)EmptyKey._value);
      LookupBucketFor<llbuild::core::KeyID>
                (this,(KeyID *)TheBucket_local,
                 (DenseMapPair<llbuild::core::KeyID,_DBKeyID> **)&NumBuckets);
    }
  }
  else {
    grow(this,uVar3 << 1);
    LookupBucketFor<llbuild::core::KeyID>
              (this,(KeyID *)TheBucket_local,
               (DenseMapPair<llbuild::core::KeyID,_DBKeyID> **)&NumBuckets);
    EmptyKey._value._0_4_ = getNumBuckets(this);
  }
  if (_NumBuckets == (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x22a,
                  "BucketT *llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>, LookupKeyT = llbuild::core::KeyID]"
                 );
  }
  incrementNumEntries(this);
  local_38 = getEmptyKey();
  LHS = detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>::getFirst(_NumBuckets);
  bVar2 = DenseMapInfo<llbuild::core::KeyID>::isEqual(LHS,&local_38);
  if (!bVar2) {
    decrementNumTombstones(this);
  }
  return _NumBuckets;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }